

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

bool __thiscall ParsedH264TrackData::spsppsExists(ParsedH264TrackData *this,uint8_t *buff,int size)

{
  bool bVar1;
  bool local_51;
  NALType nalUnitType;
  uint32_t *cur32;
  uint32_t elSize;
  bool ppsFound;
  bool spsFound;
  uint8_t *end;
  uint8_t *curPos;
  int size_local;
  uint8_t *buff_local;
  ParsedH264TrackData *this_local;
  
  bVar1 = false;
  cur32._6_1_ = false;
  for (end = buff; end < buff + ((long)size - (long)(int)(uint)this->m_nalSize);
      end = end + ((uint32_t)cur32 + this->m_nalSize)) {
    if (this->m_nalSize == '\x04') {
      cur32._0_4_ = my_ntohl(*(uint32_t *)end);
    }
    else {
      cur32._0_4_ = (uint)*end * 0x10000 + (uint)end[1] * 0x100 + (uint)end[2];
    }
    if ((end[this->m_nalSize] & 0x1f) == 7) {
      bVar1 = true;
    }
    else if ((end[this->m_nalSize] & 0x1f) == 8) {
      cur32._6_1_ = true;
    }
  }
  local_51 = false;
  if (bVar1) {
    local_51 = cur32._6_1_;
  }
  return local_51;
}

Assistant:

bool ParsedH264TrackData::spsppsExists(uint8_t* buff, const int size)
{
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    bool spsFound = false;
    bool ppsFound = false;
    while (curPos < end - m_nalSize)
    {
        uint32_t elSize;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        const auto nalUnitType = static_cast<NALUnit::NALType>(curPos[m_nalSize] & 0x1f);
        if (nalUnitType == NALUnit::NALType::nuSPS)
            spsFound = true;
        else if (nalUnitType == NALUnit::NALType::nuPPS)
            ppsFound = true;
        curPos += elSize + m_nalSize;
    }
    return spsFound && ppsFound;
}